

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void DebugNodeDockNodeFlags(ImGuiDockNodeFlags *p_flags,char *label,bool enabled)

{
  ImVec2 local_24;
  byte local_19;
  char *pcStack_18;
  bool enabled_local;
  char *label_local;
  ImGuiDockNodeFlags *p_flags_local;
  
  local_19 = enabled;
  pcStack_18 = label;
  label_local = (char *)p_flags;
  ImGui::PushID(label);
  ImVec2::ImVec2(&local_24,0.0,0.0);
  ImGui::PushStyleVar(0xb,&local_24);
  ImGui::Text("%s:",pcStack_18);
  if ((local_19 & 1) == 0) {
    ImGui::BeginDisabled(true);
  }
  ImGui::CheckboxFlags("NoSplit",(int *)label_local,0x10);
  ImGui::CheckboxFlags("NoResize",(int *)label_local,0x20);
  ImGui::CheckboxFlags("NoResizeX",(int *)label_local,0x400000);
  ImGui::CheckboxFlags("NoResizeY",(int *)label_local,0x800000);
  ImGui::CheckboxFlags("NoTabBar",(int *)label_local,0x1000);
  ImGui::CheckboxFlags("HiddenTabBar",(int *)label_local,0x2000);
  ImGui::CheckboxFlags("NoWindowMenuButton",(int *)label_local,0x4000);
  ImGui::CheckboxFlags("NoCloseButton",(int *)label_local,0x8000);
  ImGui::CheckboxFlags("NoDocking",(int *)label_local,0x10000);
  ImGui::CheckboxFlags("NoDockingSplitMe",(int *)label_local,0x20000);
  ImGui::CheckboxFlags("NoDockingSplitOther",(int *)label_local,0x40000);
  ImGui::CheckboxFlags("NoDockingOverMe",(int *)label_local,0x80000);
  ImGui::CheckboxFlags("NoDockingOverOther",(int *)label_local,0x100000);
  ImGui::CheckboxFlags("NoDockingOverEmpty",(int *)label_local,0x200000);
  if ((local_19 & 1) == 0) {
    ImGui::EndDisabled();
  }
  ImGui::PopStyleVar(1);
  ImGui::PopID();
  return;
}

Assistant:

static void DebugNodeDockNodeFlags(ImGuiDockNodeFlags* p_flags, const char* label, bool enabled)
{
    using namespace ImGui;
    PushID(label);
    PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(0.0f, 0.0f));
    Text("%s:", label);
    if (!enabled)
        BeginDisabled();
    CheckboxFlags("NoSplit", p_flags, ImGuiDockNodeFlags_NoSplit);
    CheckboxFlags("NoResize", p_flags, ImGuiDockNodeFlags_NoResize);
    CheckboxFlags("NoResizeX", p_flags, ImGuiDockNodeFlags_NoResizeX);
    CheckboxFlags("NoResizeY",p_flags, ImGuiDockNodeFlags_NoResizeY);
    CheckboxFlags("NoTabBar", p_flags, ImGuiDockNodeFlags_NoTabBar);
    CheckboxFlags("HiddenTabBar", p_flags, ImGuiDockNodeFlags_HiddenTabBar);
    CheckboxFlags("NoWindowMenuButton", p_flags, ImGuiDockNodeFlags_NoWindowMenuButton);
    CheckboxFlags("NoCloseButton", p_flags, ImGuiDockNodeFlags_NoCloseButton);
    CheckboxFlags("NoDocking", p_flags, ImGuiDockNodeFlags_NoDocking);
    CheckboxFlags("NoDockingSplitMe", p_flags, ImGuiDockNodeFlags_NoDockingSplitMe);
    CheckboxFlags("NoDockingSplitOther", p_flags, ImGuiDockNodeFlags_NoDockingSplitOther);
    CheckboxFlags("NoDockingOverMe", p_flags, ImGuiDockNodeFlags_NoDockingOverMe);
    CheckboxFlags("NoDockingOverOther", p_flags, ImGuiDockNodeFlags_NoDockingOverOther);
    CheckboxFlags("NoDockingOverEmpty", p_flags, ImGuiDockNodeFlags_NoDockingOverEmpty);
    if (!enabled)
        EndDisabled();
    PopStyleVar();
    PopID();
}